

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderProperties.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TessellationShaderPropertiesDefaultContextWideValues::iterate
          (TessellationShaderPropertiesDefaultContextWideValues *this)

{
  ostringstream *poVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  deUint32 dVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar8;
  TestError *this_00;
  NotSupportedError *this_01;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  GLboolean bool_value [4];
  int local_23c;
  GLfloat float_value [4];
  GLenum local_208;
  uint local_204 [11];
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  GLint int_value [4];
  undefined1 local_1b0 [384];
  long lVar7;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"Tessellation shader functionality not supported, skipping",
               (allocator<char> *)&local_208);
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1b0);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  local_208 = (this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES;
  local_204[0] = 1;
  local_204[1] = 3;
  local_204[2] = 0x8e74;
  local_204[3] = 4;
  local_204[4] = 1;
  local_204[5] = 0x8e73;
  local_204[6] = 2;
  local_204[7] = 1;
  uVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  lVar9 = 0x24;
  if ((uVar4 & 0x300) == 0) {
    lVar9 = 0xc;
  }
  lVar8 = 0;
  do {
    if (lVar9 == lVar8) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    bool_value[0] = '\0';
    bool_value[1] = '\0';
    bool_value[2] = '\0';
    bool_value[3] = '\0';
    float_value[0] = 0.0;
    float_value[1] = 0.0;
    float_value[2] = 0.0;
    float_value[3] = 0.0;
    int_value[0] = 0;
    int_value[1] = 0;
    int_value[2] = 0;
    int_value[3] = 0;
    uVar2 = *(undefined4 *)((long)&local_208 + lVar8);
    iVar3 = *(int *)((long)local_204 + lVar8 + 4);
    uVar4 = *(uint *)((long)local_204 + lVar8);
    (**(code **)(lVar7 + 0x798))(uVar2,bool_value);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGetBooleanv() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x58);
    (**(code **)(lVar7 + 0x818))(uVar2,float_value);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGetFloatv() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x5b);
    (**(code **)(lVar7 + 0x868))(uVar2,int_value);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGetIntegerv() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x5e);
    local_23c = (uint)(iVar3 != 0) * 0x1010101;
    local_1d8 = iVar3;
    iStack_1d4 = iVar3;
    iStack_1d0 = iVar3;
    iStack_1cc = iVar3;
    iVar6 = bcmp(&local_23c,bool_value,(long)(int)uVar4);
    if (iVar6 != 0) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"glGetBooleanv() called for pname ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1," reported invalid value.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid value reported by glGetBooleanv()",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x6e);
      goto LAB_00d0e47f;
    }
    iVar6 = bcmp(&local_1d8,int_value,(long)(int)uVar4 * 4);
    if (iVar6 != 0) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"glGetIntegerv() called for pname ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1," reported invalid value.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid value reported by glGetIntegerv()",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x76);
      goto LAB_00d0e47f;
    }
    if (0 < (int)uVar4) {
      fVar10 = (float)iVar3;
      fVar11 = float_value[0] - fVar10;
      fVar12 = -fVar11;
      if (-fVar11 <= fVar11) {
        fVar12 = fVar11;
      }
      if (1e-05 < fVar12) {
LAB_00d0e2c6:
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"glGetFloatv() called for pname ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1," reported invalid value.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid value reported by glGetFloatv()",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                   ,0x81);
LAB_00d0e47f:
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (uVar4 != 1) {
        fVar11 = float_value[1] - fVar10;
        fVar12 = -fVar11;
        if (-fVar11 <= fVar11) {
          fVar12 = fVar11;
        }
        if (1e-05 < fVar12) goto LAB_00d0e2c6;
        if (2 < uVar4) {
          fVar11 = float_value[2] - fVar10;
          fVar12 = -fVar11;
          if (-fVar11 <= fVar11) {
            fVar12 = fVar11;
          }
          if (1e-05 < fVar12) goto LAB_00d0e2c6;
          if (uVar4 != 3) {
            fVar10 = float_value[3] - fVar10;
            fVar12 = -fVar10;
            if (-fVar10 <= fVar10) {
              fVar12 = fVar10;
            }
            if (1e-05 < fVar12) goto LAB_00d0e2c6;
          }
        }
      }
    }
    lVar8 = lVar8 + 0xc;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderPropertiesDefaultContextWideValues::iterate(void)
{
	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Iterate through all context-wide properties and compare expected values
	 * against the reference ones
	 */
	const float			  epsilon = (float)1e-5;
	const glw::Functions& gl	  = m_context.getRenderContext().getFunctions();

	const glw::GLint property_value_data[] = { /* pname */ /* n components */ /* default value */
											   static_cast<glw::GLint>(m_glExtTokens.PATCH_VERTICES), 1, 3,
											   /* The following values are only applicable to Desktop OpenGL. */
											   GL_PATCH_DEFAULT_OUTER_LEVEL, 4, 1, GL_PATCH_DEFAULT_INNER_LEVEL, 2, 1 };

	const unsigned int n_properties = (glu::isContextTypeES(m_context.getRenderContext().getType())) ? 1 : 3;

	for (unsigned int n_property = 0; n_property < n_properties; ++n_property)
	{
		glw::GLboolean bool_value[4]  = { GL_FALSE };
		glw::GLfloat   float_value[4] = { 0.0f };
		glw::GLint	 int_value[4]   = { 0 };

		glw::GLenum pname		   = property_value_data[n_property * 3 + 0];
		glw::GLint  n_components   = property_value_data[n_property * 3 + 1];
		glw::GLint  expected_value = property_value_data[n_property * 3 + 2];

		/* Call all relevant getters */
		gl.getBooleanv(pname, bool_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv() failed.");

		gl.getFloatv(pname, float_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() failed.");

		gl.getIntegerv(pname, int_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed.");

		/* Compare retrieved vector value components against expected value */
		glw::GLboolean expected_bool_value[4] = {
			(expected_value != 0) ? (glw::GLboolean)GL_TRUE : (glw::GLboolean)GL_FALSE,
			(expected_value != 0) ? (glw::GLboolean)GL_TRUE : (glw::GLboolean)GL_FALSE,
			(expected_value != 0) ? (glw::GLboolean)GL_TRUE : (glw::GLboolean)GL_FALSE,
			(expected_value != 0) ? (glw::GLboolean)GL_TRUE : (glw::GLboolean)GL_FALSE
		};
		glw::GLint expected_int_value[4] = { expected_value, expected_value, expected_value, expected_value };

		if (memcmp(expected_bool_value, bool_value, sizeof(bool) * n_components) != 0)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "glGetBooleanv() called for pname " << pname
							   << " reported invalid value." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported by glGetBooleanv()");
		}

		if (memcmp(expected_int_value, int_value, sizeof(int) * n_components) != 0)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "glGetIntegerv() called for pname " << pname
							   << " reported invalid value." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported by glGetIntegerv()");
		}

		if ((n_components >= 1 && de::abs(float_value[0] - (float)expected_value) > epsilon) ||
			(n_components >= 2 && de::abs(float_value[1] - (float)expected_value) > epsilon) ||
			(n_components >= 3 && de::abs(float_value[2] - (float)expected_value) > epsilon) ||
			(n_components >= 4 && de::abs(float_value[3] - (float)expected_value) > epsilon))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "glGetFloatv() called for pname " << pname
							   << " reported invalid value." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported by glGetFloatv()");
		}
	} /* for (all properties) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}